

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpg.c
# Opt level: O1

void skip_input_data(j_decompress_ptr cinfo,long num_bytes)

{
  jpeg_source_mgr *pjVar1;
  size_t sVar2;
  size_t sVar3;
  
  pjVar1 = cinfo->src;
  sVar2 = pjVar1->bytes_in_buffer;
  sVar3 = sVar2 - num_bytes;
  if ((long)sVar2 < num_bytes) {
    al_fseek(pjVar1[1].bytes_in_buffer,num_bytes - sVar2,1);
    sVar3 = 0;
  }
  else {
    pjVar1->next_input_byte = pjVar1->next_input_byte + num_bytes;
  }
  pjVar1->bytes_in_buffer = sVar3;
  return;
}

Assistant:

static void skip_input_data(j_decompress_ptr cinfo, long num_bytes)
{
   struct my_src_mgr *src = (void *)cinfo->src;
   if (num_bytes <= (long)src->pub.bytes_in_buffer) {
      src->pub.next_input_byte += num_bytes;
      src->pub.bytes_in_buffer -= num_bytes;
   }
   else {
      long skip = num_bytes - src->pub.bytes_in_buffer;
      al_fseek(src->fp, skip, ALLEGRO_SEEK_CUR);
      src->pub.bytes_in_buffer = 0;
   }
}